

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O2

void __thiscall
ParticleFilter::prediction
          (ParticleFilter *this,double delta_t,double *std,double velocity,double yaw_rate)

{
  pointer pPVar1;
  uint uVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  double dVar6;
  result_type rVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dist;
  normal_distribution<double> ns_y;
  normal_distribution<double> ns_x;
  normal_distribution<double> ns_t;
  random_device rd;
  mt19937 gen;
  
  lVar5 = 0x18;
  uVar4 = 0;
  while( true ) {
    pPVar1 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x28) <= uVar4)
    break;
    dVar8 = *(double *)((long)&pPVar1->id + lVar5);
    ::std::random_device::random_device(&rd);
    uVar2 = ::std::random_device::_M_getval();
    ::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&gen,(ulong)uVar2);
    ns_x._M_param._M_stddev = *std;
    ns_x._M_param._M_mean = 0.0;
    ns_x._M_saved = 0.0;
    ns_x._M_saved_available = false;
    ns_y._M_param._M_stddev = std[1];
    ns_y._M_param._M_mean = 0.0;
    ns_y._M_saved = 0.0;
    ns_y._M_saved_available = false;
    ns_t._M_param._M_stddev = std[2];
    ns_t._M_param._M_mean = 0.0;
    ns_t._M_saved = 0.0;
    ns_t._M_saved_available = false;
    if (0.001 <= ABS(yaw_rate)) {
      dVar6 = delta_t * yaw_rate + dVar8;
      dVar9 = sin(dVar6);
      dVar10 = sin(dVar8);
      rVar7 = ::std::normal_distribution<double>::operator()(&ns_x,&gen);
      pPVar1 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)pPVar1 + lVar5 + -0x10) =
           rVar7 + ((dVar9 - dVar10) * velocity) / yaw_rate +
           *(double *)((long)pPVar1 + lVar5 + -0x10);
      dVar8 = cos(dVar8);
      dVar6 = cos(dVar6);
      rVar7 = ::std::normal_distribution<double>::operator()(&ns_y,&gen);
      pPVar1 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)pPVar1 + lVar5 + -8) =
           rVar7 + ((dVar8 - dVar6) * velocity) / yaw_rate + *(double *)((long)pPVar1 + lVar5 + -8);
      rVar7 = ::std::normal_distribution<double>::operator()(&ns_t,&gen);
      dVar8 = rVar7 + delta_t * yaw_rate;
      pdVar3 = (double *)
               ((long)&((this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>.
                        _M_impl.super__Vector_impl_data._M_start)->id + lVar5);
    }
    else {
      dVar6 = cos(dVar8);
      rVar7 = ::std::normal_distribution<double>::operator()(&ns_x,&gen);
      pPVar1 = (this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(double *)((long)pPVar1 + lVar5 + -0x10) =
           dVar6 * delta_t * velocity + rVar7 + *(double *)((long)pPVar1 + lVar5 + -0x10);
      dVar8 = sin(dVar8);
      rVar7 = ::std::normal_distribution<double>::operator()(&ns_y,&gen);
      dVar8 = dVar8 * delta_t * velocity + rVar7;
      pdVar3 = &(this->particles).super__Vector_base<Particle,_std::allocator<Particle>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4].y;
    }
    *pdVar3 = dVar8 + *pdVar3;
    ::std::random_device::~random_device(&rd);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x28;
  }
  return;
}

Assistant:

void ParticleFilter::prediction(double delta_t, double std[], double velocity, double yaw_rate) 
{
  for (int i=0; i<particles.size(); i++)
  {
    double dist = velocity * delta_t;
    double theta = particles[i].theta;

    std::random_device rd;
    std::mt19937 gen(rd());
    std::normal_distribution<> ns_x(0.0, std[0]);
    std::normal_distribution<> ns_y(0.0, std[1]);
    std::normal_distribution<> ns_t(0.0, std[2]);

    // Conditionally do the full prediction including yaw rate
    if (fabs(yaw_rate) < 0.001)
    {
      particles[i].x += dist * cos(theta) + ns_x(gen);
      particles[i].y += dist * sin(theta) + ns_y(gen);
    }
    else
    {
      particles[i].x += velocity * (sin(theta + yaw_rate * delta_t) - sin(theta)) / yaw_rate + ns_x(gen);
      particles[i].y += velocity * (cos(theta) - cos(theta + yaw_rate * delta_t)) / yaw_rate + ns_y(gen);
      particles[i].theta += yaw_rate * delta_t + ns_t(gen);
    }
  }
}